

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hrec_set_val(bcf_hrec_t *hrec,int i,char *str,int len,int is_quoted)

{
  char *pcVar1;
  size_t __n;
  
  if (str == (char *)0x0) {
    hrec->vals[i] = (char *)0x0;
  }
  else {
    pcVar1 = hrec->vals[i];
    if (pcVar1 != (char *)0x0) {
      free(pcVar1);
    }
    if (is_quoted == 0) {
      pcVar1 = (char *)malloc((long)(len + 1));
      hrec->vals[i] = pcVar1;
      memcpy(hrec->vals[i],str,(long)len);
      hrec->vals[i][len] = '\0';
    }
    else {
      pcVar1 = (char *)malloc((long)(len + 3));
      hrec->vals[i] = pcVar1;
      *hrec->vals[i] = '\"';
      __n = (size_t)len;
      memcpy(hrec->vals[i] + 1,str,__n);
      hrec->vals[i][__n + 1] = '\"';
      hrec->vals[i][__n + 2] = '\0';
    }
  }
  return;
}

Assistant:

void bcf_hrec_set_val(bcf_hrec_t *hrec, int i, const char *str, int len, int is_quoted)
{
    if ( !str ) { hrec->vals[i] = NULL; return; }
    if ( hrec->vals[i] ) free(hrec->vals[i]);
    if ( is_quoted )
    {
        hrec->vals[i] = (char*) malloc((len+3)*sizeof(char));
        hrec->vals[i][0] = '"';
        memcpy(&hrec->vals[i][1],str,len);
        hrec->vals[i][len+1] = '"';
        hrec->vals[i][len+2] = 0;
    }
    else
    {
        hrec->vals[i] = (char*) malloc((len+1)*sizeof(char));
        memcpy(hrec->vals[i],str,len);
        hrec->vals[i][len] = 0;
    }
}